

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

stbfile * stb_open(char *filename,char *mode)

{
  FILE *f;
  stbfile *psVar1;
  
  f = stb_fopen(filename,mode + (*mode == 'k'));
  if ((f != (FILE *)0x0) && (psVar1 = stb_openf(f), psVar1 != (stbfile *)0x0)) {
    psVar1->close = stb__fclose2;
    (psVar1->field_12).various = (*mode == 'k') + 1;
    return psVar1;
  }
  return (stbfile *)0x0;
}

Assistant:

stbfile *stb_open(char *filename, char *mode)
{
   FILE *f = stb_fopen(filename, mode[0] == 'k' ? mode+1 : mode);
   stbfile *s;
   if (f == NULL) return NULL;
   s = stb_openf(f);
   if (s) {
      s->close = stb__fclose2;
      s->various = mode[0] == 'k' ? stb_keep_if_different : stb_keep_yes;
   }
   return s;
}